

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeData.cpp
# Opt level: O3

char16 * NativeCodeData::GetDataDescription(void *data,JitArenaAllocator *alloc)

{
  long lVar1;
  short sVar2;
  DataChunk *pDVar3;
  size_t sVar4;
  char16 *pcVar5;
  long lVar6;
  size_t byteSize;
  ulong uVar7;
  long lVar8;
  char16 *pcVar9;
  WCHAR local_838 [4];
  char16 buf [1024];
  
  pDVar3 = GetDataChunk(data);
  memset((WCHAR (*) [1024])local_838,0,0x800);
  swprintf_s<1024ul>((WCHAR (*) [1024])local_838,
                     L"%hs, NativeCodeData: index: %x, len: %x, offset: +%x",pDVar3->dataType,
                     (ulong)pDVar3->allocIndex,(ulong)pDVar3->len,(ulong)pDVar3->offset);
  sVar4 = PAL_wcslen((char16_t *)local_838);
  pcVar9 = (char16 *)&DAT_00000008;
  uVar7 = sVar4 + 1;
  if (uVar7 != 0) {
    buf._2040_8_ = uVar7 * 2;
    lVar8 = -1;
    byteSize = 0xffffffffffffffff;
    if (-1 < (long)uVar7) {
      byteSize = buf._2040_8_;
    }
    pcVar9 = (char16 *)0x0;
    pcVar5 = (char16 *)new__<Memory::JitArenaAllocator>(byteSize,alloc,0x3eba5c);
    if (pcVar5 != (char16 *)0x0) {
      lVar6 = 0;
      do {
        sVar2 = *(short *)((long)local_838 + lVar6);
        *(short *)((long)pcVar5 + lVar6) = sVar2;
        if (sVar2 == 0) {
          if (uVar7 <= (ulong)-lVar8) {
            return pcVar5;
          }
          memset((void *)((long)pcVar5 + lVar6 + 2),0xfd,sVar4 * 2 - lVar6);
          return pcVar5;
        }
        lVar6 = lVar6 + 2;
        lVar1 = sVar4 + lVar8;
        lVar8 = lVar8 + -1;
      } while (lVar1 != -1);
      *pcVar5 = L'\0';
      if (sVar4 != 0) {
        memset(pcVar5 + 1,0xfd,buf._2040_8_ - 2);
      }
      RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
      return pcVar5;
    }
  }
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  return pcVar9;
}

Assistant:

char16*
NativeCodeData::GetDataDescription(void* data, JitArenaAllocator * alloc)
{
    auto chunk = GetDataChunk(data);
    char16 buf[1024] = { 0 };
#if DBG
    swprintf_s(buf, _u("%hs, NativeCodeData: index: %x, len: %x, offset: +%x"), chunk->dataType, chunk->allocIndex, chunk->len, chunk->offset);
#else
    swprintf_s(buf, _u("NativeCodeData: index: %x, len: %x, offset: +%x"), chunk->allocIndex, chunk->len, chunk->offset);
#endif
    auto len = wcslen(buf) + 1;
    auto desc = JitAnewArray(alloc, char16, len);
    wcscpy_s(desc, len, buf);
    return desc;
}